

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall CLI::Option::matching_name_abi_cxx11_(Option *this,Option *other)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  string *this_00;
  byte bVar5;
  string *name;
  string *lname;
  pointer pbVar6;
  string *sname;
  string *__str;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_)
     , iVar4 != 0)) {
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_.field_2;
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_._M_string_length = 0;
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(::std::__cxx11::string::~string,
                 &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_);
  }
  bVar5 = (other->super_OptionBase<CLI::Option>).configurable_ &
          (this->super_OptionBase<CLI::Option>).configurable_;
  pbVar1 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (this->snames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    ::std::__cxx11::string::string((string *)&local_50,pbVar6);
    bVar2 = check_sname(other,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      return pbVar6;
    }
    if (bVar5 != 0) {
      ::std::__cxx11::string::string((string *)&local_70,pbVar6);
      bVar2 = check_lname(other,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) {
        return pbVar6;
      }
    }
  }
  pbVar1 = (this->lnames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (this->lnames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    ::std::__cxx11::string::string((string *)&local_f0,pbVar6);
    bVar2 = check_lname(other,&local_f0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    if (bVar2) {
      return pbVar6;
    }
    if ((pbVar6->_M_string_length == 1 & bVar5) == 1) {
      ::std::__cxx11::string::string((string *)&local_90,pbVar6);
      bVar2 = check_sname(other,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      if (bVar2) {
        return pbVar6;
      }
    }
  }
  if (bVar5 == 0) goto LAB_00185067;
  if ((((this->snames_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->snames_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      ((this->lnames_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->lnames_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && ((this->pname_)._M_string_length != 0)) {
    __str = &this->pname_;
    ::std::__cxx11::string::string((string *)&local_150,__str);
    bVar2 = check_sname(other,&local_150);
    if (bVar2) {
      this_00 = &local_150;
      goto LAB_001851ee;
    }
    ::std::__cxx11::string::string((string *)&local_110,__str);
    name = &local_110;
    bVar2 = check_lname(other,name);
    if (!bVar2) {
      _Var3 = ::std::operator==(__str,&other->pname_);
      ::std::__cxx11::string::~string((string *)&local_110);
      ::std::__cxx11::string::~string((string *)&local_150);
      if (_Var3) {
        return __str;
      }
      goto LAB_0018504f;
    }
    this_00 = &local_150;
  }
  else {
LAB_0018504f:
    if ((((other->snames_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (other->snames_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) ||
        ((other->fnames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (other->fnames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) || ((other->pname_)._M_string_length == 0)) {
LAB_00185067:
      if (((this->super_OptionBase<CLI::Option>).ignore_case_ != false) ||
         ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true)) {
        pbVar1 = (other->snames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (other->snames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          ::std::__cxx11::string::string((string *)&local_b0,pbVar6);
          bVar2 = check_sname(this,&local_b0);
          ::std::__cxx11::string::~string((string *)&local_b0);
          if (bVar2) {
            return pbVar6;
          }
        }
        pbVar1 = (other->lnames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (other->lnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          ::std::__cxx11::string::string((string *)&local_d0,pbVar6);
          bVar2 = check_lname(this,&local_d0);
          ::std::__cxx11::string::~string((string *)&local_d0);
          if (bVar2) {
            return pbVar6;
          }
        }
      }
      return &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
    }
    __str = &other->pname_;
    ::std::__cxx11::string::string((string *)&local_170,__str);
    bVar2 = check_sname(this,&local_170);
    if (bVar2) {
      this_00 = &local_170;
      goto LAB_001851ee;
    }
    ::std::__cxx11::string::string((string *)&local_130,__str);
    name = &local_130;
    bVar2 = check_lname(this,name);
    if (!bVar2) {
      _Var3 = ::std::operator==(&this->pname_,__str);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::__cxx11::string::~string((string *)&local_170);
      if (_Var3) {
        return __str;
      }
      goto LAB_00185067;
    }
    this_00 = &local_170;
  }
  ::std::__cxx11::string::~string((string *)name);
LAB_001851ee:
  ::std::__cxx11::string::~string((string *)this_00);
  return __str;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &Option::matching_name(const Option &other) const {
    static const std::string estring;
    bool bothConfigurable = configurable_ && other.configurable_;
    for(const std::string &sname : snames_) {
        if(other.check_sname(sname))
            return sname;
        if(bothConfigurable && other.check_lname(sname))
            return sname;
    }
    for(const std::string &lname : lnames_) {
        if(other.check_lname(lname))
            return lname;
        if(lname.size() == 1 && bothConfigurable) {
            if(other.check_sname(lname)) {
                return lname;
            }
        }
    }
    if(bothConfigurable && snames_.empty() && lnames_.empty() && !pname_.empty()) {
        if(other.check_sname(pname_) || other.check_lname(pname_) || pname_ == other.pname_)
            return pname_;
    }
    if(bothConfigurable && other.snames_.empty() && other.fnames_.empty() && !other.pname_.empty()) {
        if(check_sname(other.pname_) || check_lname(other.pname_) || (pname_ == other.pname_))
            return other.pname_;
    }
    if(ignore_case_ ||
       ignore_underscore_) {  // We need to do the inverse, in case we are ignore_case or ignore underscore
        for(const std::string &sname : other.snames_)
            if(check_sname(sname))
                return sname;
        for(const std::string &lname : other.lnames_)
            if(check_lname(lname))
                return lname;
    }
    return estring;
}